

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CConnman::StopThreads(CConnman *this)

{
  long lVar1;
  bool bVar2;
  thread *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  bVar2 = std::thread::joinable(in_RDI);
  if (bVar2) {
    std::thread::join();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CConnman::StopThreads()
{
    if (threadI2PAcceptIncoming.joinable()) {
        threadI2PAcceptIncoming.join();
    }
    if (threadMessageHandler.joinable())
        threadMessageHandler.join();
    if (threadOpenConnections.joinable())
        threadOpenConnections.join();
    if (threadOpenAddedConnections.joinable())
        threadOpenAddedConnections.join();
    if (threadDNSAddressSeed.joinable())
        threadDNSAddressSeed.join();
    if (threadSocketHandler.joinable())
        threadSocketHandler.join();
}